

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool cJSON_ReplaceItemViaPointer(cJSON *parent,cJSON *item,cJSON *replacement)

{
  cJSON *in_RDX;
  cJSON *in_RSI;
  long in_RDI;
  cJSON_bool local_4;
  
  if (((in_RDI == 0) || (in_RDX == (cJSON *)0x0)) || (in_RSI == (cJSON *)0x0)) {
    local_4 = 0;
  }
  else if (in_RDX == in_RSI) {
    local_4 = 1;
  }
  else {
    in_RDX->next = in_RSI->next;
    in_RDX->prev = in_RSI->prev;
    if (in_RDX->next != (cJSON *)0x0) {
      in_RDX->next->prev = in_RDX;
    }
    if (in_RDX->prev != (cJSON *)0x0) {
      in_RDX->prev->next = in_RDX;
    }
    if (*(cJSON **)(in_RDI + 0x10) == in_RSI) {
      *(cJSON **)(in_RDI + 0x10) = in_RDX;
    }
    in_RSI->next = (cJSON *)0x0;
    in_RSI->prev = (cJSON *)0x0;
    cJSON_Delete(in_RDX);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_ReplaceItemViaPointer(cJSON * const parent, cJSON * const item, cJSON * replacement)
{
    if ((parent == NULL) || (replacement == NULL) || (item == NULL))
    {
        return false;
    }

    if (replacement == item)
    {
        return true;
    }

    replacement->next = item->next;
    replacement->prev = item->prev;

    if (replacement->next != NULL)
    {
        replacement->next->prev = replacement;
    }
    if (replacement->prev != NULL)
    {
        replacement->prev->next = replacement;
    }
    if (parent->child == item)
    {
        parent->child = replacement;
    }

    item->next = NULL;
    item->prev = NULL;
    cJSON_Delete(item);

    return true;
}